

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::ReferenceContext::invalidateSubFramebuffer
          (ReferenceContext *this,deUint32 target,int numAttachments,deUint32 *attachments,int x,
          int y,int width,int height)

{
  MultisampleConstPixelBufferAccess *this_00;
  deUint32 dVar1;
  Framebuffer *pFVar2;
  int iVar3;
  int iVar4;
  int width_00;
  int i;
  int iVar5;
  long lVar6;
  deUint32 dVar7;
  MultisamplePixelBufferAccess *color;
  deUint32 dVar8;
  deUint32 dVar9;
  int ndx;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  Vec4 colorClearValue;
  MultisamplePixelBufferAccess access;
  MultisamplePixelBufferAccess buf;
  char local_e4 [4];
  int local_e0;
  int local_dc;
  ReferenceContext *local_d8;
  int local_cc;
  MultisamplePixelBufferAccess local_c8;
  undefined1 local_98 [32];
  int local_78;
  int local_74;
  int local_70;
  MultisamplePixelBufferAccess local_58;
  
  if (target == 0x8d40) {
    if (((numAttachments < 0) || (attachments == (deUint32 *)0x0 && 1 < numAttachments)) ||
       ((height | width) < 0)) {
      if (this->m_lastError == 0) {
        this->m_lastError = 0x501;
      }
    }
    else {
      local_98._0_4_ = R;
      local_98._4_4_ = SNORM_INT8;
      local_98._8_4_ = 0;
      local_98._12_4_ = 0;
      pFVar2 = this->m_drawFramebufferBinding;
      local_e4[2] = 0;
      local_e4[1] = 0;
      if (numAttachments == 0) {
        local_e4[0] = 0;
      }
      else {
        bVar12 = pFVar2 != (Framebuffer *)0x0;
        dVar7 = 0x1800;
        if (bVar12) {
          dVar7 = 0x8ce0;
        }
        dVar8 = 0x1801;
        if (bVar12) {
          dVar8 = 0x8d00;
        }
        dVar9 = 0x1802;
        if (bVar12) {
          dVar9 = 0x8d20;
        }
        local_e4[1] = 0;
        local_e4[2] = 0;
        uVar11 = 0;
        local_e4[0] = 0;
        do {
          dVar1 = attachments[uVar11];
          if (((dVar1 != dVar7) && (dVar1 != dVar8)) &&
             ((dVar1 != dVar9 && (dVar1 != 0x821a || pFVar2 == (Framebuffer *)0x0)))) {
            if (this->m_lastError != 0) {
              return;
            }
            this->m_lastError = 0x501;
            return;
          }
          if (dVar1 == dVar7) {
            local_e4[0] = 1;
          }
          if (dVar1 == 0x821a && pFVar2 != (Framebuffer *)0x0) {
            local_e4[1] = 1;
            local_e4[2] = 1;
          }
          if (dVar1 == dVar8) {
            local_e4[1] = 1;
          }
          if (dVar1 == dVar9) {
            local_e4[2] = 1;
          }
          uVar11 = uVar11 + 1;
        } while ((uint)numAttachments != uVar11);
        local_d8 = this;
        local_cc = x;
      }
      iVar5 = 0;
      if (0 < x) {
        iVar5 = x;
      }
      local_d8 = (ReferenceContext *)CONCAT44(local_d8._4_4_,iVar5);
      iVar5 = 0;
      if (0 < y) {
        iVar5 = y;
      }
      local_e0 = width + x;
      local_dc = height + y;
      this_00 = (MultisampleConstPixelBufferAccess *)(local_98 + 0x18);
      lVar10 = 0;
      do {
        if (local_e4[lVar10] == '\x01') {
          if (lVar10 == 0) {
            getDrawColorbuffer(&local_58,this);
          }
          else {
            if (lVar10 != 1) {
              getDrawStencilbuffer(&local_c8,this);
            }
            else {
              getDrawDepthbuffer(&local_c8,this);
            }
            tcu::getEffectiveDepthStencilAccess
                      ((PixelBufferAccess *)this_00,&local_c8.m_access,(uint)(lVar10 != 1));
            rr::MultisamplePixelBufferAccess::fromMultisampleAccess((PixelBufferAccess *)this_00);
          }
          rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
                    (this_00,&local_58);
          if (((local_78 != 0) && (local_74 != 0)) && (local_70 != 0)) {
            iVar3 = local_58.m_access.super_ConstPixelBufferAccess.m_size.m_data[1];
            if (local_e0 <= local_58.m_access.super_ConstPixelBufferAccess.m_size.m_data[1]) {
              iVar3 = local_e0;
            }
            iVar4 = local_58.m_access.super_ConstPixelBufferAccess.m_size.m_data[2];
            if (local_dc <= local_58.m_access.super_ConstPixelBufferAccess.m_size.m_data[2]) {
              iVar4 = local_dc;
            }
            width_00 = iVar3 - (int)local_d8;
            if (iVar3 - (int)local_d8 < 1) {
              width_00 = 0;
            }
            iVar3 = iVar4 - iVar5;
            if (iVar4 - iVar5 < 1) {
              iVar3 = 0;
            }
            rr::getSubregion((MultisamplePixelBufferAccess *)this_00,&local_58,(int)local_d8,iVar5,
                             width_00,iVar3);
            if (lVar10 == 0) {
              color = (MultisamplePixelBufferAccess *)local_98;
            }
            else {
              if (lVar10 != 1) {
                if (lVar10 == 2) {
                  local_c8.m_access.super_ConstPixelBufferAccess.m_format.order = R;
                  local_c8.m_access.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
                  local_c8.m_access.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
                  local_c8.m_access.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
                  rr::clear((MultisamplePixelBufferAccess *)this_00,(IVec4 *)&local_c8);
                }
                goto LAB_009a92f0;
              }
              lVar6 = 0;
              do {
                local_c8.m_access.super_ConstPixelBufferAccess.m_size.m_data[lVar6 + -2] =
                     0x3f800000;
                lVar6 = lVar6 + 1;
              } while (lVar6 != 4);
              color = &local_c8;
            }
            rr::clear((MultisamplePixelBufferAccess *)this_00,(Vec4 *)color);
          }
        }
LAB_009a92f0:
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
    }
  }
  else if (this->m_lastError == 0) {
    this->m_lastError = 0x500;
  }
  return;
}

Assistant:

void ReferenceContext::invalidateSubFramebuffer (deUint32 target, int numAttachments, const deUint32* attachments, int x, int y, int width, int height)
{
	RC_IF_ERROR(target != GL_FRAMEBUFFER, GL_INVALID_ENUM, RC_RET_VOID);
	RC_IF_ERROR((numAttachments < 0) || (numAttachments > 1 && attachments == DE_NULL), GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(width < 0 || height < 0, GL_INVALID_VALUE, RC_RET_VOID);

	// \todo [2012-07-17 pyry] Support multiple color attachments.

	const Vec4		colorClearValue		(0.0f);
	const float		depthClearValue		= 1.0f;
	const int		stencilClearValue	= 0;

	bool			isFboBound			= m_drawFramebufferBinding != DE_NULL;
	bool			discardBuffers[3]	= { false, false, false }; // Color, depth, stencil

	for (int attNdx = 0; attNdx < numAttachments; attNdx++)
	{
		bool	isColor			= attachments[attNdx] == (isFboBound ? GL_COLOR_ATTACHMENT0		: GL_COLOR);
		bool	isDepth			= attachments[attNdx] == (isFboBound ? GL_DEPTH_ATTACHMENT		: GL_DEPTH);
		bool	isStencil		= attachments[attNdx] == (isFboBound ? GL_STENCIL_ATTACHMENT	: GL_STENCIL);
		bool	isDepthStencil	= isFboBound && attachments[attNdx] == GL_DEPTH_STENCIL_ATTACHMENT;

		RC_IF_ERROR(!isColor && !isDepth && !isStencil && !isDepthStencil, GL_INVALID_VALUE, RC_RET_VOID);

		if (isColor)						discardBuffers[0] = true;
		if (isDepth || isDepthStencil)		discardBuffers[1] = true;
		if (isStencil || isDepthStencil)	discardBuffers[2] = true;
	}

	for (int ndx = 0; ndx < 3; ndx++)
	{
		if (!discardBuffers[ndx])
			continue;

		bool								isColor					= ndx == 0;
		bool								isDepth					= ndx == 1;
		bool								isStencil				= ndx == 2;
		rr::MultisamplePixelBufferAccess	buf						= isColor ? getDrawColorbuffer()								:
																	  isDepth ? getDepthMultisampleAccess(getDrawDepthbuffer())		:
																				getStencilMultisampleAccess(getDrawStencilbuffer());

		if (isEmpty(buf))
			continue;

		tcu::IVec4							area					= intersect(tcu::IVec4(0, 0, buf.raw().getHeight(), buf.raw().getDepth()), tcu::IVec4(x, y, width, height));
		rr::MultisamplePixelBufferAccess	access					= rr::getSubregion(buf, area.x(), area.y(), area.z(), area.w());

		if (isColor)
			rr::clear(access, colorClearValue);
		else if (isDepth)
			rr::clear(access, tcu::Vec4(depthClearValue));
		else if (isStencil)
			rr::clear(access, tcu::IVec4(stencilClearValue));
	}
}